

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
* __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::operator=(token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
            *this,token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                  *other)

{
  jsonpath_token_kind jVar1;
  
  if (other != this) {
    jVar1 = this->token_kind_;
    if (jVar1 == other->token_kind_) {
      switch(jVar1) {
      case literal:
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
                  (&(this->field_1).value_,&(other->field_1).value_);
        break;
      case selector:
      case function:
      case unary_operator:
      case binary_operator:
        (this->field_1).selector_ = (other->field_1).selector_;
        break;
      case end_function:
      case argument:
        break;
      default:
        if (jVar1 == expression) {
          std::
          __uniq_ptr_impl<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_>_>
          ::operator=((__uniq_ptr_impl<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_>_>
                       *)&(this->field_1).expression_,
                      (__uniq_ptr_impl<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_>_>
                       *)&(other->field_1).expression_);
        }
      }
    }
    else {
      destroy(this);
      construct(this,other);
    }
  }
  return this;
}

Assistant:

token& operator=(token&& other) noexcept
        {

            if (&other != this)
            {
                if (token_kind_ == other.token_kind_)
                {
                    switch (token_kind_)
                    {
                        case jsonpath_token_kind::selector:
                            selector_ = other.selector_;
                            break;
                        case jsonpath_token_kind::expression:
                            expression_ = std::move(other.expression_);
                            break;
                        case jsonpath_token_kind::unary_operator:
                            unary_operator_ = other.unary_operator_;
                            break;
                        case jsonpath_token_kind::binary_operator:
                            binary_operator_ = other.binary_operator_;
                            break;
                        case jsonpath_token_kind::function:
                            function_ = other.function_;
                            break;
                        case jsonpath_token_kind::literal:
                            value_ = std::move(other.value_);
                            break;
                        default:
                            break;
                    }
                }
                else
                {
                    destroy();
                    construct(std::move(other));
                }
            }
            return *this;
        }